

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

Opnd * __thiscall LowererMD::Simd128CanonicalizeToBoolsBeforeReduction(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRType type;
  short sVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  LowererMD *dst;
  RegOpnd *newSrc;
  LowererMD *pLStack_28;
  OpCode cmpOpcode;
  Opnd *src1;
  Instr *instr_local;
  LowererMD *this_local;
  
  src1 = (Opnd *)instr;
  instr_local = (Instr *)this;
  pLStack_28 = (LowererMD *)IR::Instr::GetSrc1(instr);
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (bVar2) {
    newSrc._6_2_ = 0x100;
    sVar3 = (short)*(undefined4 *)&src1[3]._vptr_Opnd;
    if (((ushort)(sVar3 - 0x2d3U) < 2) || ((ushort)(sVar3 - 0x3c1U) < 2)) {
      newSrc._6_2_ = 0x45f;
    }
    else if ((ushort)(sVar3 - 0x3cbU) < 2) {
      newSrc._6_2_ = 0x460;
    }
    else if ((ushort)(sVar3 - 0x3d1U) < 2) {
      newSrc._6_2_ = 0x45e;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x874,"((0))","UNREACHED");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    type = IR::Opnd::GetType((Opnd *)pLStack_28);
    dst = (LowererMD *)IR::RegOpnd::New(type,this->m_func);
    Lowerer::InsertMove((Opnd *)dst,(Opnd *)pLStack_28,(Instr *)src1,true);
    Simd128CanonicalizeToBools(this,(Instr *)src1,(OpCode *)((long)&newSrc + 6),(Opnd *)dst);
    this_local = dst;
  }
  else {
    this_local = pLStack_28;
  }
  return (Opnd *)this_local;
}

Assistant:

IR::Opnd* LowererMD::Simd128CanonicalizeToBoolsBeforeReduction(IR::Instr* instr)
{
    IR::Opnd* src1 = instr->GetSrc1();
    if (m_func->GetJITFunctionBody()->IsWasmFunction())
    {
        Js::OpCode cmpOpcode = Js::OpCode::InvalidOpCode;
        switch (instr->m_opcode)
        {
        case Js::OpCode::Simd128_AnyTrue_B4:
        case Js::OpCode::Simd128_AnyTrue_B2:
        case Js::OpCode::Simd128_AllTrue_B4:
        case Js::OpCode::Simd128_AllTrue_B2:
            cmpOpcode = Js::OpCode::PCMPEQD;
            break;
        case Js::OpCode::Simd128_AnyTrue_B8:
        case Js::OpCode::Simd128_AllTrue_B8:
            cmpOpcode = Js::OpCode::PCMPEQW;
            break;
        case Js::OpCode::Simd128_AnyTrue_B16:
        case Js::OpCode::Simd128_AllTrue_B16:
            cmpOpcode = Js::OpCode::PCMPEQB;
            break;
        default:
            Assert(UNREACHED);
        }

        IR::RegOpnd * newSrc = IR::RegOpnd::New(src1->GetType(), m_func);
        m_lowerer->InsertMove(newSrc, src1, instr);
        Simd128CanonicalizeToBools(instr, cmpOpcode, *newSrc);
        return newSrc;
    }
    return src1;
}